

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

Data * __thiscall QUtcTimeZonePrivate::data(QUtcTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  int iVar1;
  qint64 in_RDX;
  long in_RSI;
  Data *in_RDI;
  Data *d;
  Data *this_00;
  
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x30);
  QTimeZonePrivate::Data::Data(this_00);
  QString::operator=(&this_00->abbreviation,&in_RDI->abbreviation);
  this_00->atMSecsSinceEpoch = in_RDX;
  iVar1 = *(int *)(in_RSI + 0x74);
  this_00->offsetFromUtc = iVar1;
  this_00->standardTimeOffset = iVar1;
  this_00->daylightTimeOffset = 0;
  return in_RDI;
}

Assistant:

QTimeZonePrivate::Data QUtcTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    Data d;
    d.abbreviation = m_abbreviation;
    d.atMSecsSinceEpoch = forMSecsSinceEpoch;
    d.standardTimeOffset = d.offsetFromUtc = m_offsetFromUtc;
    d.daylightTimeOffset = 0;
    return d;
}